

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O2

void vinlet_dspprolog(_vinlet *x,t_signal **parentsigs,int myvecsize,int calcsize,int phase,
                     int period,int frequency,int downsample,int upsample,int reblock,int switched)

{
  int outsize;
  int iVar1;
  t_sample *__s;
  t_sample **pptVar2;
  t_signal *sig;
  uint uVar3;
  uint method;
  long lVar4;
  t_signal *ptVar5;
  
  if (x->x_buf != (t_sample *)0x0) {
    (x->x_updown).downsample = downsample;
    (x->x_updown).upsample = upsample;
    if (reblock == 0) {
      iVar1 = inlet_getsignalindex(x->x_inlet);
      ptVar5 = parentsigs[iVar1];
    }
    else {
      if (parentsigs == (t_signal **)0x0) {
        iVar1 = 1;
        sig = (t_signal *)0x0;
        outsize = iVar1;
      }
      else {
        iVar1 = inlet_getsignalindex(x->x_inlet);
        sig = parentsigs[iVar1];
        iVar1 = sig->s_vecsize;
        outsize = (iVar1 * upsample) / downsample;
      }
      if (myvecsize < outsize) {
        myvecsize = outsize;
      }
      lVar4 = (long)myvecsize;
      if (myvecsize != x->x_bufsize) {
        freebytes(x->x_buf,(long)x->x_bufsize << 2);
        __s = (t_sample *)getbytes(lVar4 * 4);
        memset(__s,0,lVar4 * 4);
        x->x_bufsize = myvecsize;
        x->x_endbuf = __s + lVar4;
        x->x_buf = __s;
      }
      if (parentsigs == (t_signal **)0x0) {
        ptVar5 = (t_signal *)0x0;
        memset(x->x_buf,0,lVar4 << 2);
      }
      else {
        uVar3 = period - 1U & phase - 1U;
        lVar4 = 0;
        if (uVar3 != 0) {
          lVar4 = -(long)(int)((period - uVar3) * outsize);
        }
        x->x_hop = outsize * period;
        x->x_fill = x->x_endbuf + lVar4;
        if (upsample * downsample == 1) {
          pptVar2 = &sig->s_vec;
        }
        else {
          uVar3 = (x->x_updown).method;
          method = (uint)(0x2b < pd_compatibilitylevel);
          if (uVar3 != 0xffffffff) {
            method = uVar3;
          }
          resamplefrom_dsp(&x->x_updown,sig->s_vec,iVar1,outsize,method);
          pptVar2 = &(x->x_updown).s_vec;
        }
        ptVar5 = (t_signal *)0x0;
        dsp_add(vinlet_doprolog,3,x,*pptVar2,(long)outsize);
        if (sig->s_refcount == 0) {
          signal_makereusable(sig);
          ptVar5 = (t_signal *)0x0;
        }
      }
    }
    x->x_directsignal = ptVar5;
  }
  return;
}

Assistant:

void vinlet_dspprolog(struct _vinlet *x, t_signal **parentsigs,
    int myvecsize, int calcsize, int phase, int period, int frequency,
    int downsample, int upsample,  int reblock, int switched)
{
    t_signal *insig;
        /* no buffer means we're not a signal inlet */
    if (!x->x_buf)
        return;
    x->x_updown.downsample = downsample;
    x->x_updown.upsample   = upsample;

        /* if the "reblock" flag is set, arrange to copy data in from the
        parent. */
    if (reblock)
    {
        int parentvecsize, bufsize, oldbufsize, prologphase;
        int re_parentvecsize; /* resampled parentvectorsize */
            /* this should never happen: */
        if (!x->x_buf) return;

            /* the prolog code counts from 0 to period-1; the
            phase is backed up by one so that AFTER the prolog code
            runs, the "x_fill" phase is in sync with the "x_read" phase. */
        prologphase = (phase - 1) & (period - 1);
        if (parentsigs)
        {
            insig = parentsigs[inlet_getsignalindex(x->x_inlet)];
            parentvecsize = insig->s_vecsize;
            re_parentvecsize = parentvecsize * upsample / downsample;
        }
        else
        {
            insig = 0;
            parentvecsize = 1;
            re_parentvecsize = 1;
        }

        bufsize = re_parentvecsize;
        if (bufsize < myvecsize) bufsize = myvecsize;
        if (bufsize != (oldbufsize = x->x_bufsize))
        {
            t_sample *buf = x->x_buf;
            t_freebytes(buf, oldbufsize * sizeof(*buf));
            buf = (t_sample *)t_getbytes(bufsize * sizeof(*buf));
            memset((char *)buf, 0, bufsize * sizeof(*buf));
            x->x_bufsize = bufsize;
            x->x_endbuf = buf + bufsize;
            x->x_buf = buf;
        }
        if (parentsigs)
        {
            x->x_hop = period * re_parentvecsize;

            x->x_fill = prologphase ?
                x->x_endbuf - (x->x_hop - prologphase * re_parentvecsize) :
                    x->x_endbuf;

            if (upsample * downsample == 1)
                    dsp_add(vinlet_doprolog, 3, x, insig->s_vec,
                        (t_int)re_parentvecsize);
            else {
              int method = (x->x_updown.method == -1?
                  (pd_compatibilitylevel < 44 ? 0 : 1) : x->x_updown.method);
              resamplefrom_dsp(&x->x_updown, insig->s_vec, parentvecsize,
                  re_parentvecsize, method);
              dsp_add(vinlet_doprolog, 3, x, x->x_updown.s_vec,
                  (t_int)re_parentvecsize);
        }

            /* if the input signal's reference count is zero, we have
               to free it here because we didn't in ugen_doit(). */
            if (!insig->s_refcount)
                signal_makereusable(insig);
        }
        else memset((char *)(x->x_buf), 0, bufsize * sizeof(*x->x_buf));
        x->x_directsignal = 0;
    }
    else
    {
            /* no reblocking; in this case our output signal is "borrowed"
            and merely needs to be pointed to the real one. */
        x->x_directsignal = parentsigs[inlet_getsignalindex(x->x_inlet)];
    }
}